

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O1

void __thiscall
I2sAnalyzer::AnalyzeSubFrame(I2sAnalyzer *this,U32 starting_index,U32 num_bits,U32 subframe_index)

{
  pointer puVar1;
  I2sAnalyzerSettings *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  FrameV2 frame_v2;
  Frame frame;
  FrameV2 local_60 [8];
  unsigned_long_long local_58;
  unsigned_long_long local_50;
  ulong local_48;
  byte local_38;
  undefined1 local_37;
  
  uVar6 = num_bits + starting_index;
  uVar7 = (ulong)starting_index;
  if (((this->mSettings)._M_ptr)->mShiftOrder == LsbFirst) {
    if (starting_index < uVar6) {
      uVar3 = 1;
      uVar8 = 0;
      uVar4 = uVar7;
      do {
        uVar5 = 0;
        if ((this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] == BIT_HIGH) {
          uVar5 = uVar3;
        }
        uVar8 = uVar8 | uVar5;
        uVar3 = uVar3 * 2;
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      goto LAB_0010634c;
    }
  }
  else if (starting_index < uVar6) {
    uVar4 = 1L << ((char)num_bits - 1U & 0x3f);
    uVar8 = 0;
    uVar3 = uVar7;
    do {
      uVar5 = 0;
      if ((this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] == BIT_HIGH) {
        uVar5 = uVar4;
      }
      uVar8 = uVar8 | uVar5;
      uVar4 = uVar4 >> 1;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
    goto LAB_0010634c;
  }
  uVar8 = 0;
LAB_0010634c:
  Frame::Frame((Frame *)&local_58);
  local_38 = (((this->mSettings)._M_ptr)->mWordSelectInverted != WS_INVERTED ^ (byte)subframe_index)
             & 1;
  local_37 = 0;
  puVar1 = (this->mDataValidEdges).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = puVar1[uVar7];
  local_50 = puVar1[uVar6 - 1];
  local_48 = uVar8;
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  FrameV2::FrameV2(local_60);
  FrameV2::AddInteger((char *)local_60,0x10a1c6);
  pIVar2 = (this->mSettings)._M_ptr;
  if (pIVar2->mSigned == SignedInteger) {
    AnalyzerHelpers::ConvertToSignedNumber(local_48,pIVar2->mBitsPerWord);
  }
  FrameV2::AddInteger((char *)local_60,0x10a038);
  AnalyzerResults::AddFrameV2((FrameV2 *)(this->mResults)._M_ptr,(char *)local_60,0x10a038,local_58)
  ;
  FrameV2::~FrameV2(local_60);
  Frame::~Frame((Frame *)&local_58);
  return;
}

Assistant:

void I2sAnalyzer::AnalyzeSubFrame( U32 starting_index, U32 num_bits, U32 subframe_index )
{
    U64 result = 0;
    U32 target_count = starting_index + num_bits;

    if( mSettings->mShiftOrder == AnalyzerEnums::LsbFirst )
    {
        U64 bit_value = 1ULL;
        for( U32 i = starting_index; i < target_count; i++ )
        {
            if( mDataBits[ i ] == BIT_HIGH )
                result |= bit_value;

            bit_value <<= 1;
        }
    }
    else
    {
        U64 bit_value = 1ULL << ( num_bits - 1 );
        for( U32 i = starting_index; i < target_count; i++ )
        {
            if( mDataBits[ i ] == BIT_HIGH )
                result |= bit_value;

            bit_value >>= 1;
        }
    }

    // enum I2sResultType { Channel1, Channel2, ErrorTooFewBits, ErrorDoesntDivideEvenly };
    // add result bubble
    Frame frame;
    frame.mData1 = result;


    U32 channel_1_polarity = 1;
    if( mSettings->mWordSelectInverted == WS_INVERTED )
        channel_1_polarity = 0;

    if( ( subframe_index & 0x1 ) == channel_1_polarity )
        frame.mType = U8( Channel1 );
    else
        frame.mType = U8( Channel2 );

    frame.mFlags = 0;
    frame.mStartingSampleInclusive = mDataValidEdges[ starting_index ];
    frame.mEndingSampleInclusive = mDataValidEdges[ starting_index + num_bits - 1 ];
    mResults->AddFrame( frame );
    FrameV2 frame_v2;
    frame_v2.AddInteger( "channel", frame.mType );
    S64 adjusted_value = result;
    if( mSettings->mSigned == AnalyzerEnums::SignedInteger )
    {
        adjusted_value = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
    }
    frame_v2.AddInteger( "data", adjusted_value );
    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
}